

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppLogger.cpp
# Opt level: O0

void __thiscall
CppLogger::CppLogger::CppLogger(CppLogger *this,Level t_Level,char *t_Name,bool exitOnFatal)

{
  initializer_list<CppLogger::FormatAttribute> t_Format;
  Format *this_00;
  initializer_list<CppLogger::FormatAttribute> local_70;
  FormatAttribute local_5c [3];
  iterator local_50;
  undefined8 local_48;
  Format *local_40;
  allocator<char> local_22;
  byte local_21;
  char *pcStack_20;
  bool exitOnFatal_local;
  char *t_Name_local;
  CppLogger *pCStack_10;
  Level t_Level_local;
  CppLogger *this_local;
  
  this->m_Level = t_Level;
  local_21 = exitOnFatal;
  pcStack_20 = t_Name;
  t_Name_local._4_4_ = t_Level;
  pCStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_Name,t_Name,&local_22);
  std::allocator<char>::~allocator(&local_22);
  local_40 = (Format *)&this->field_0x28;
  local_5c[0] = Time;
  local_5c[1] = 1;
  local_5c[2] = 4;
  local_50 = local_5c;
  local_48 = 3;
  t_Format._M_len = 3;
  t_Format._M_array = local_50;
  Format::Format(local_40,t_Format);
  local_40 = (Format *)&this->field_0x40;
  do {
    this_00 = local_40;
    std::initializer_list<CppLogger::FormatAttribute>::initializer_list(&local_70);
    Format::Format(this_00,local_70);
    local_40 = this_00 + 1;
  } while (local_40 != (Format *)&this->m_ExitOnFatal);
  this->m_ExitOnFatal = (bool)(local_21 & 1);
  this->m_TraceStream = (ostream *)&std::cout;
  this->m_InfoStream = (ostream *)&std::cout;
  this->m_WarnStream = (ostream *)&std::cout;
  this->m_ErrorStream = (ostream *)&std::cout;
  this->m_FatalErrorStream = (ostream *)&std::cout;
  std::__cxx11::string::string
            ((string *)&this->m_TraceColor,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Color::white_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)&this->m_InfoColor,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Color::green_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)&this->m_WarnColor,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Color::yellow_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)&this->m_ErrorColor,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Color::red_abi_cxx11_);
  std::__cxx11::string::string
            ((string *)&this->m_FatalErrorColor,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Color::red_abi_cxx11_);
  return;
}

Assistant:

CppLogger::CppLogger(Level t_Level, const char* t_Name, bool exitOnFatal)
        :m_Level(t_Level), m_Name(t_Name), m_ExitOnFatal(exitOnFatal) {}